

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O0

int recursiveDetectTest(char *filename,char *result,char *err,int options)

{
  long lVar1;
  long lVar2;
  int res;
  xmlParserCtxtPtr ctxt;
  xmlDocPtr doc;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  lVar1 = xmlNewParserCtxt();
  lVar2 = xmlCtxtReadFile(lVar1,filename,0,6);
  if ((lVar2 == 0) && (*(int *)(lVar1 + 0x25c) == 0x59)) {
    xmlFreeParserCtxt(lVar1);
    filename_local._4_4_ = 0;
  }
  else {
    fprintf(_stderr,"Failed to detect recursion in %s\n",filename);
    xmlFreeParserCtxt(lVar1);
    xmlFreeDoc(lVar2);
    filename_local._4_4_ = 1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
recursiveDetectTest(const char *filename,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options ATTRIBUTE_UNUSED) {
    xmlDocPtr doc;
    xmlParserCtxtPtr ctxt;
    int res = 0;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    /*
     * base of the test, parse with the old API
     */
    doc = xmlCtxtReadFile(ctxt, filename, NULL,
                          XML_PARSE_NOENT | XML_PARSE_DTDLOAD);
    if ((doc != NULL) || (ctxt->lastError.code != XML_ERR_ENTITY_LOOP)) {
        fprintf(stderr, "Failed to detect recursion in %s\n", filename);
	xmlFreeParserCtxt(ctxt);
	xmlFreeDoc(doc);
        return(1);
    }
    xmlFreeParserCtxt(ctxt);

    return(res);
}